

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseLineCase::BaseLineCase
          (BaseLineCase *this,Context *context,char *name,char *desc,GLenum primitiveDrawType,
          PrimitiveWideness wideness)

{
  BaseRenderingCase::BaseRenderingCase(&this->super_BaseRenderingCase,context,name,desc,0x100);
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_0071c4b8;
  this->m_iteration = 0;
  this->m_iterationCount = 3;
  this->m_primitiveDrawType = primitiveDrawType;
  this->m_primitiveWideness = wideness;
  this->m_allIterationsPassed = true;
  this->m_multisampleRelaxationRequired = false;
  (this->super_BaseRenderingCase).m_lineWidth =
       *(float *)(&DAT_005bd810 + (ulong)(wideness == PRIMITIVEWIDENESS_WIDE) * 4);
  return;
}

Assistant:

BaseLineCase::BaseLineCase (Context& context, const char* name, const char* desc, glw::GLenum primitiveDrawType, PrimitiveWideness wideness)
	: BaseRenderingCase					(context, name, desc)
	, m_iteration						(0)
	, m_iterationCount					(3)
	, m_primitiveDrawType				(primitiveDrawType)
	, m_primitiveWideness				(wideness)
	, m_allIterationsPassed				(true)
	, m_multisampleRelaxationRequired	(false)
{
	DE_ASSERT(m_primitiveWideness < PRIMITIVEWIDENESS_LAST);
	m_lineWidth = (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) ? (s_wideSize) : (1.0f);
}